

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

uint32_t cab_checksum_cfdata_4(void *p,size_t bytes,uint32_t seed)

{
  uint32_t uVar1;
  uint in_EDX;
  ulong in_RSI;
  void *in_RDI;
  uint32_t sum;
  uint u32num;
  uchar *b;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  
  local_28 = in_EDX;
  local_20 = in_RDI;
  for (local_24 = (uint)(in_RSI >> 2) & 0x3fffffff; local_24 != 0; local_24 = local_24 - 1) {
    uVar1 = archive_le32dec(local_20);
    local_28 = uVar1 ^ local_28;
    local_20 = (void *)((long)local_20 + 4);
  }
  return local_28;
}

Assistant:

static uint32_t
cab_checksum_cfdata_4(const void *p, size_t bytes, uint32_t seed)
{
	const unsigned char *b;
	unsigned u32num;
	uint32_t sum;

	u32num = (unsigned)bytes / 4;
	sum = seed;
	b = p;
	for (;u32num > 0; --u32num) {
		sum ^= archive_le32dec(b);
		b += 4;
	}
	return (sum);
}